

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O0

HANDLE init_std_handle(HANDLE *pStd,FILE *stream)

{
  int iVar1;
  int *piVar2;
  undefined1 *puStack_70;
  int new_fd;
  HANDLE hFile;
  CObjectAttributes oa;
  IFileLockController *pLockController;
  CFileProcessLocalData *pLocalData;
  IDataLock *pDataLock;
  IPalObject *pRegisteredFile;
  IPalObject *pFileObject;
  CPalThread *pCStack_20;
  PAL_ERROR palError;
  CPalThread *pThread;
  FILE *stream_local;
  HANDLE *pStd_local;
  
  pThread = (CPalThread *)stream;
  stream_local = (FILE *)pStd;
  pCStack_20 = CorUnix::InternalGetCurrentThread();
  pFileObject._4_4_ = 0;
  pRegisteredFile = (IPalObject *)0x0;
  pDataLock = (IDataLock *)0x0;
  pLocalData = (CFileProcessLocalData *)0x0;
  pLockController = (IFileLockController *)0x0;
  oa.pSecurityAttributes = (LPSECURITY_ATTRIBUTES)0x0;
  CorUnix::CObjectAttributes::CObjectAttributes((CObjectAttributes *)&hFile);
  puStack_70 = &DAT_ffffffffffffffff;
  iVar1 = fileno((FILE *)pThread);
  iVar1 = dup(iVar1);
  if (iVar1 == -1) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    piVar2 = __errno_location();
    strerror(*piVar2);
  }
  else {
    pFileObject._4_4_ =
         (**(code **)*CorUnix::g_pObjectManager)
                   (CorUnix::g_pObjectManager,pCStack_20,CorUnix::otFile,&hFile,&pRegisteredFile);
    if ((pFileObject._4_4_ == 0) &&
       (pFileObject._4_4_ =
             (*pRegisteredFile->_vptr_IPalObject[3])
                       (pRegisteredFile,pCStack_20,1,&pLocalData,&pLockController),
       pFileObject._4_4_ == 0)) {
      *(undefined4 *)&pLockController[0x203]._vptr_IFileLockController = 1;
      *(int *)&pLockController[1]._vptr_IFileLockController = iVar1;
      *(undefined4 *)((long)&pLockController[1]._vptr_IFileLockController + 4) = 0;
      *(undefined4 *)&pLockController[2]._vptr_IFileLockController = 0;
      *(undefined4 *)((long)&pLockController[2]._vptr_IFileLockController + 4) = 0;
      pLockController->_vptr_IFileLockController = (_func_int **)oa.pSecurityAttributes;
      oa.pSecurityAttributes = (LPSECURITY_ATTRIBUTES)0x0;
      (*(code *)pLocalData->pLockController->_vptr_IFileLockController)(pLocalData,pCStack_20,1);
      pLocalData = (CFileProcessLocalData *)0x0;
      pFileObject._4_4_ =
           (**(code **)(*CorUnix::g_pObjectManager + 8))
                     (CorUnix::g_pObjectManager,pCStack_20,pRegisteredFile,CorUnix::aotFile,0,
                      &stack0xffffffffffffff90,&pDataLock);
      pRegisteredFile = (IPalObject *)0x0;
    }
  }
  if (oa.pSecurityAttributes != (LPSECURITY_ATTRIBUTES)0x0) {
    (**(code **)(*(long *)oa.pSecurityAttributes + 0x18))();
  }
  if (pLocalData != (CFileProcessLocalData *)0x0) {
    (*(code *)pLocalData->pLockController->_vptr_IFileLockController)(pLocalData,pCStack_20,1);
  }
  if (pRegisteredFile != (IPalObject *)0x0) {
    (*pRegisteredFile->_vptr_IPalObject[8])(pRegisteredFile,pCStack_20);
  }
  if (pDataLock != (IDataLock *)0x0) {
    (*pDataLock->_vptr_IDataLock[8])(pDataLock,pCStack_20);
  }
  if (pFileObject._4_4_ == 0) {
    *(undefined1 **)stream_local = puStack_70;
  }
  else if (iVar1 != -1) {
    close(iVar1);
  }
  return puStack_70;
}

Assistant:

static HANDLE init_std_handle(HANDLE * pStd, FILE *stream)
{
    CPalThread *pThread = InternalGetCurrentThread();
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pFileObject = NULL;
    IPalObject *pRegisteredFile = NULL;
    IDataLock *pDataLock = NULL;
    CFileProcessLocalData *pLocalData = NULL;
    IFileLockController *pLockController = NULL;
    CObjectAttributes oa;

    HANDLE hFile = INVALID_HANDLE_VALUE;
    int new_fd = -1;

    /* duplicate the FILE *, so that we can fclose() in FILECloseHandle without
       closing the original */
    new_fd = dup(fileno(stream));
    if(-1 == new_fd)
    {
        ERROR("dup() failed; errno is %d (%s)\n", errno, strerror(errno));
        goto done;
    }

    palError = g_pObjectManager->AllocateObject(
        pThread,
        &otFile,
        &oa,
        &pFileObject
        );

    if (NO_ERROR != palError)
    {
        goto done;
    }

    palError = pFileObject->GetProcessLocalData(
        pThread,
        WriteLock,
        &pDataLock,
        reinterpret_cast<void**>(&pLocalData)
        );

    if (NO_ERROR != palError)
    {
        goto done;
    }

    pLocalData->inheritable = TRUE;
    pLocalData->unix_fd = new_fd;
    pLocalData->dwDesiredAccess = 0;
    pLocalData->open_flags = 0;
    pLocalData->open_flags_deviceaccessonly = FALSE;

    //
    // Transfer the lock controller reference from our local variable
    // to the local file data
    //

    pLocalData->pLockController = pLockController;
    pLockController = NULL;

    //
    // We've finished initializing our local data, so release that lock
    //

    pDataLock->ReleaseLock(pThread, TRUE);
    pDataLock = NULL;

    palError = g_pObjectManager->RegisterObject(
        pThread,
        pFileObject,
        &aotFile, 
        0,
        &hFile,
        &pRegisteredFile
        );

    //
    // pFileObject is invalidated by the call to RegisterObject, so NULL it
    // out here to ensure that we don't try to release a reference on
    // it down the line.
    //

    pFileObject = NULL;

done:

    if (NULL != pLockController)
    {
        pLockController->ReleaseController();
    }

    if (NULL != pDataLock)
    {
        pDataLock->ReleaseLock(pThread, TRUE);
    }

    if (NULL != pFileObject)
    {
        pFileObject->ReleaseReference(pThread);
    }

    if (NULL != pRegisteredFile)
    {
        pRegisteredFile->ReleaseReference(pThread);
    }

    if (NO_ERROR == palError)
    {
        *pStd = hFile;
    }
    else if (-1 != new_fd)
    {
        close(new_fd);
    }

    return hFile;
}